

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandwidthControlTest.cpp
# Opt level: O2

void __thiscall test::BWCTestConnection::OnConnect(BWCTestConnection *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  TonkStatusEx statusEx;
  TonkStatusEx TStack_218;
  LogStringBuffer local_198;
  
  tonk::SDKConnection::GetStatusEx(&TStack_218,&this->super_SDKConnection);
  if (DAT_0019d6c0 < 2) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = Logger;
    local_198.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&DAT_0019d6f0);
    std::operator<<((ostream *)this_00,"Connected with ");
    std::operator<<((ostream *)this_00,TStack_218.Remote.NetworkString);
    std::operator<<((ostream *)this_00," : ");
    std::ostream::operator<<((ostream *)this_00,TStack_218.Remote.UDPPort);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void BWCTestConnection::OnConnect()
{
    //TonkStatus status = GetStatus();
    TonkStatusEx statusEx = GetStatusEx();
    Logger.Debug("Connected with ", statusEx.Remote.NetworkString, " : ", statusEx.Remote.UDPPort);
}